

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int *piVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  short sVar7;
  short sVar8;
  bool bVar9;
  short sVar10;
  bool bVar11;
  short sVar12;
  bool bVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [16];
  unkbyte10 Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ushort uVar23;
  parasail_result_t *ppVar24;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  uint uVar25;
  long lVar26;
  int16_t *piVar27;
  ulong uVar28;
  char *pcVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  char *__format;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  int16_t iVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  undefined8 unaff_R14;
  ulong uVar47;
  long lVar48;
  short sVar49;
  undefined4 uVar50;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined4 uVar51;
  undefined1 auVar54 [16];
  short sVar56;
  short sVar62;
  undefined1 auVar55 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ushort uVar69;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  undefined1 auVar70 [16];
  ushort uVar79;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int16_t *local_270;
  undefined1 local_258 [16];
  long local_238;
  short local_208;
  short sStack_206;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  long local_158;
  long local_150;
  ulong local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  int *local_108;
  int *local_100;
  int *local_f8;
  int *local_f0;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar84;
  short sVar87;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar29 = "_s2";
  }
  else {
    uVar47 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar29 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar29 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar29 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar29 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        uVar32 = (ulong)(uint)matrix->length;
LAB_0065ffd0:
        uVar25 = (uint)uVar32;
        uVar45 = s2Len + 7;
        iVar35 = -open;
        iVar31 = matrix->min;
        iVar42 = -iVar31;
        if (iVar31 != iVar35 && SBORROW4(iVar31,iVar35) == iVar31 + open < 0) {
          iVar42 = open;
        }
        uVar33 = iVar42 - 0x7fff;
        iVar31 = matrix->max;
        auVar52 = pshuflw(ZEXT416(uVar33),ZEXT416(uVar33),0);
        uVar50 = auVar52._0_4_;
        local_208 = auVar52._0_2_;
        sStack_206 = auVar52._2_2_;
        local_d8 = 0;
        local_1b8 = (undefined1  [16])0x0;
        if (s1_beg == 0) {
          auVar52 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
          local_d8 = auVar52._0_4_;
        }
        local_168._0_8_ = CONCAT26(sStack_206,CONCAT24(local_208,uVar50));
        local_168._8_8_ = CONCAT26(sStack_206,CONCAT24(local_208,uVar50));
        local_178._8_8_ = local_168._8_8_;
        local_178._0_8_ = local_168._0_8_;
        local_c8._8_8_ = local_168._8_8_;
        local_c8._0_8_ = local_168._0_8_;
        local_188._8_8_ = local_168._8_8_;
        local_188._0_8_ = local_168._0_8_;
        uVar23 = (ushort)iVar35;
        sVar15 = (short)gap;
        if (s1_beg == 0) {
          local_1b8._8_8_ =
               (ulong)(uint)(gap * 0xfffd - open) & 0xffff |
               (ulong)(ushort)(uVar23 + sVar15 * -2) << 0x10 |
               (ulong)(ushort)(uVar23 - sVar15) << 0x20 | (ulong)uVar23 << 0x30;
          local_1b8._0_8_ =
               (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
               (ulong)(ushort)(sVar15 * -6 - (short)open) << 0x10 |
               (ulong)(ushort)(sVar15 * -5 - (short)open) << 0x20 |
               (ulong)(ushort)(uVar23 + sVar15 * -4) << 0x30;
        }
        uStack_d4 = local_d8;
        uStack_d0 = local_d8;
        uStack_cc = local_d8;
        ppVar24 = parasail_result_new_table1(uVar25,s2Len);
        if (ppVar24 != (parasail_result_t *)0x0) {
          ppVar24->flag =
               (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
               (uint)(s2_end != 0) << 0xf | ppVar24->flag | 0x8221002;
          uVar39 = (ulong)(s2Len + 0xe);
          ptr = parasail_memalign_int16_t(0x10,uVar39);
          ptr_00 = parasail_memalign_int16_t(0x10,uVar39);
          ptr_01 = parasail_memalign_int16_t(0x10,uVar39);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar48 = (long)(int)uVar25;
            if (matrix->type == 0) {
              local_270 = parasail_memalign_int16_t(0x10,(long)(int)(uVar25 + 7));
              uVar39 = 0;
              if (local_270 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar28 = 0;
              if (0 < (int)uVar25) {
                uVar28 = uVar32;
              }
              for (; lVar26 = lVar48, uVar28 != uVar39; uVar39 = uVar39 + 1) {
                local_270[uVar39] = (int16_t)matrix->mapper[(byte)_s1[uVar39]];
              }
              for (; lVar26 < (int)(uVar25 + 7); lVar26 = lVar26 + 1) {
                local_270[lVar26] = 0;
              }
            }
            else {
              local_270 = (int16_t *)0x0;
            }
            auVar52 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R14 >> 0x10),0x7ffe - (short)iVar31
                                            ));
            auVar53 = pshuflw(ZEXT416(uVar25),ZEXT416(uVar25),0);
            auVar63 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
            auVar66 = pshuflw(auVar52,auVar52,0);
            auVar70 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            auVar52 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar51 = auVar53._0_4_;
            local_58._4_4_ = uVar51;
            local_58._0_4_ = uVar51;
            local_58._8_4_ = uVar51;
            local_58._12_4_ = uVar51;
            auVar80._8_4_ = 0xffffffff;
            auVar80._0_8_ = 0xffffffffffffffff;
            auVar80._12_4_ = 0xffffffff;
            local_78._0_4_ = auVar63._0_4_;
            local_78._4_4_ = local_78._0_4_;
            local_78._8_4_ = local_78._0_4_;
            local_78._12_4_ = local_78._0_4_;
            local_e8 = auVar66._0_2_;
            sStack_e6 = auVar66._2_2_;
            local_88 = auVar70._0_4_;
            uStack_84 = local_88;
            uStack_80 = local_88;
            uStack_7c = local_88;
            local_98 = auVar52._0_4_;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            auVar22 = local_58;
            local_a8 = paddsw(local_58,auVar80);
            auVar52 = local_a8;
            auVar21 = local_78;
            local_68 = paddsw(auVar80,local_78);
            auVar80 = local_68;
            piVar1 = matrix->mapper;
            for (uVar32 = 0; uVar47 != uVar32; uVar32 = uVar32 + 1) {
              ptr[uVar32 + 7] = (int16_t)piVar1[(byte)_s2[uVar32]];
            }
            for (lVar26 = 0; lVar26 != 7; lVar26 = lVar26 + 1) {
              ptr[lVar26] = 0;
            }
            piVar27 = ptr + uVar47 + 7;
            for (uVar32 = uVar47; (int)uVar32 < (int)uVar45; uVar32 = (ulong)((int)uVar32 + 1)) {
              *piVar27 = 0;
              piVar27 = piVar27 + 1;
            }
            uVar32 = 0;
            iVar43 = (int16_t)uVar33;
            iVar31 = iVar35;
            if (s2_beg == 0) {
              for (; uVar47 != uVar32; uVar32 = uVar32 + 1) {
                ptr_00[uVar32 + 7] = (int16_t)iVar31;
                ptr_01[uVar32 + 7] = iVar43;
                iVar31 = iVar31 - gap;
              }
            }
            else {
              for (; uVar47 != uVar32; uVar32 = uVar32 + 1) {
                ptr_00[uVar32 + 7] = 0;
                ptr_01[uVar32 + 7] = iVar43;
              }
            }
            for (lVar26 = 0; uVar32 = uVar47, lVar26 != 7; lVar26 = lVar26 + 1) {
              ptr_00[lVar26] = iVar43;
              ptr_01[lVar26] = iVar43;
            }
            for (; (int)uVar32 < (int)uVar45; uVar32 = uVar32 + 1) {
              ptr_00[uVar32 + 7] = iVar43;
              ptr_01[uVar32 + 7] = iVar43;
            }
            ptr_00[6] = 0;
            uVar25 = uVar25 - 1;
            Var17 = CONCAT28(local_208,CONCAT26(sStack_206,CONCAT24(local_208,uVar50)));
            auVar16._10_2_ = sStack_206;
            auVar16._0_10_ = Var17;
            auVar16._12_2_ = local_208;
            auVar16._14_2_ = sStack_206;
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            local_b8 = auVar16 >> 0x10;
            auVar20 = local_b8;
            local_150 = uVar47 * 4;
            local_158 = uVar47 * 0x20;
            local_258 = pmovsxbw(auVar70,0x1020304050607);
            local_238 = 0;
            local_1a8 = CONCAT26(sStack_e6,CONCAT24(local_e8,auVar66._0_4_));
            uStack_1a0 = CONCAT26(sStack_e6,CONCAT24(local_e8,auVar66._0_4_));
            uVar32 = 0;
            auVar66 = auVar16;
            local_c8 = auVar16;
            local_188 = auVar16;
            local_48 = auVar16;
            auVar70 = auVar16;
            local_198 = auVar16;
            while ((long)uVar32 < lVar48) {
              uVar36 = (uint)uVar32;
              if (matrix->type == 0) {
                uVar34 = (uint)local_270[uVar32 + 1];
                uVar38 = (uint)local_270[uVar32 + 2];
                uVar37 = (uint)local_270[uVar32 + 3];
                uVar40 = (uint)local_270[uVar32 + 4];
                uVar44 = (uint)local_270[uVar32 + 5];
                uVar41 = (uint)local_270[uVar32 + 6];
                uVar46 = (int)local_270[uVar32];
                uVar30 = (int)local_270[uVar32 + 7];
              }
              else {
                uVar34 = uVar25;
                if ((long)(uVar32 | 1) < lVar48) {
                  uVar34 = uVar36 | 1;
                }
                uVar38 = uVar36 | 2;
                if (lVar48 <= (long)(uVar32 | 2)) {
                  uVar38 = uVar25;
                }
                uVar37 = uVar36 | 3;
                if (lVar48 <= (long)(uVar32 | 3)) {
                  uVar37 = uVar25;
                }
                uVar40 = uVar36 | 4;
                if (lVar48 <= (long)(uVar32 | 4)) {
                  uVar40 = uVar25;
                }
                uVar44 = uVar36 | 5;
                if (lVar48 <= (long)(uVar32 | 5)) {
                  uVar44 = uVar25;
                }
                uVar41 = uVar36 | 6;
                if (lVar48 <= (long)(uVar32 | 6)) {
                  uVar41 = uVar25;
                }
                uVar46 = uVar36;
                uVar30 = uVar36 | 7;
                if (lVar48 <= (long)(uVar32 | 7)) {
                  uVar30 = uVar25;
                }
              }
              local_1c0 = uVar32 | 1;
              local_1c8 = uVar32 | 6;
              local_1d0 = uVar32 | 2;
              local_1d8 = uVar32 | 3;
              local_1e0 = uVar32 | 4;
              local_1e8 = uVar32 | 5;
              local_1f0 = uVar32 | 7;
              piVar1 = matrix->matrix;
              iVar31 = matrix->size;
              local_f0 = piVar1 + (int)(uVar46 * iVar31);
              local_f8 = piVar1 + (int)(uVar38 * iVar31);
              local_100 = piVar1 + (int)(uVar40 * iVar31);
              local_108 = piVar1 + (int)(uVar41 * iVar31);
              local_b8._0_8_ = (undefined8)((unkuint10)Var17 >> 0x10);
              local_b8._8_8_ = auVar16._8_8_ >> 0x10;
              auVar67._8_8_ = local_b8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
              auVar67._0_8_ = local_b8._0_8_;
              uVar39 = (ulong)(iVar35 - uVar36 * gap);
              if (s1_beg != 0) {
                uVar39 = 0;
              }
              auVar82._8_8_ = local_b8._8_8_ | uVar39 << 0x30;
              auVar82._0_8_ = local_b8._0_8_;
              local_148 = uVar32 + 8;
              ptr_00[6] = uVar23 - (short)(uVar32 + 8) * sVar15;
              local_110 = local_150 * local_1f0;
              local_120 = local_150 * local_1d0 + -8;
              local_128 = local_150 * local_1d8 + -0xc;
              local_130 = local_150 * local_1e0 + -0x10;
              local_138 = local_150 * local_1e8 + -0x14;
              local_140 = local_150 * local_1c8 + -0x18;
              local_118 = local_150 * local_1c0 + -4;
              auVar81._0_2_ = -(ushort)(local_a8._0_2_ == local_258._0_2_);
              auVar81._2_2_ = -(ushort)(local_a8._2_2_ == local_258._2_2_);
              auVar81._4_2_ = -(ushort)(local_a8._4_2_ == local_258._4_2_);
              auVar81._6_2_ = -(ushort)(local_a8._6_2_ == local_258._6_2_);
              auVar81._8_2_ = -(ushort)(local_a8._8_2_ == local_258._8_2_);
              auVar81._10_2_ = -(ushort)(local_a8._10_2_ == local_258._10_2_);
              auVar81._12_2_ = -(ushort)(local_a8._12_2_ == local_258._12_2_);
              auVar81._14_2_ = -(ushort)(local_a8._14_2_ == local_258._14_2_);
              auVar85._4_2_ = local_208;
              auVar85._0_4_ = uVar50;
              auVar85._6_2_ = sStack_206;
              auVar85._8_2_ = local_208;
              auVar85._10_2_ = sStack_206;
              auVar85._12_2_ = local_208;
              auVar85._14_2_ = sStack_206;
              in_XMM8 = pmovsxbw(in_XMM8,0xfffefdfcfbfaf9);
              auVar91 = auVar85;
              for (uVar32 = 0; uVar45 != uVar32; uVar32 = uVar32 + 1) {
                auVar54._10_2_ = (short)(piVar1 + (int)(uVar38 * iVar31))[ptr[uVar32 + 5]];
                auVar54._8_2_ = (short)piVar1[(long)(int)(uVar37 * iVar31) + (long)ptr[uVar32 + 4]];
                auVar54._12_2_ = (short)piVar1[(long)(int)(uVar34 * iVar31) + (long)ptr[uVar32 + 6]]
                ;
                auVar54._14_2_ = (short)(piVar1 + (int)(uVar46 * iVar31))[ptr[uVar32 + 7]];
                auVar54._0_8_ =
                     (ulong)(uint)piVar1[(long)(int)(uVar30 * iVar31) + (long)ptr[uVar32]] &
                     0xffffffff0000ffff |
                     (ulong)*(ushort *)(piVar1 + (int)(uVar41 * iVar31) + ptr[uVar32 + 1]) << 0x10 |
                     (ulong)*(ushort *)
                             (piVar1 + (long)(int)(uVar44 * iVar31) + (long)ptr[uVar32 + 2]) << 0x20
                     | (ulong)*(ushort *)(piVar1 + (int)(uVar40 * iVar31) + ptr[uVar32 + 3]) << 0x30
                ;
                auVar83._0_8_ = auVar82._2_8_;
                auVar83._8_8_ = auVar82._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar32 + 7] << 0x30;
                auVar88._0_8_ = auVar91._2_8_;
                auVar88._8_8_ = auVar91._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar32 + 7] << 0x30;
                auVar19._4_4_ = local_88;
                auVar19._0_4_ = local_88;
                auVar19._8_4_ = local_88;
                auVar19._12_4_ = local_88;
                auVar64 = psubsw(auVar83,auVar19);
                auVar91._4_4_ = local_98;
                auVar91._0_4_ = local_98;
                auVar91._8_4_ = local_98;
                auVar91._12_4_ = local_98;
                auVar89 = psubsw(auVar88,auVar91);
                sVar3 = auVar64._0_2_;
                sVar84 = auVar89._0_2_;
                auVar90._0_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar64._2_2_;
                sVar84 = auVar89._2_2_;
                auVar90._2_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar64._4_2_;
                sVar84 = auVar89._4_2_;
                auVar90._4_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar64._6_2_;
                sVar84 = auVar89._6_2_;
                auVar90._6_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar64._8_2_;
                sVar84 = auVar89._8_2_;
                auVar90._8_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar64._10_2_;
                sVar84 = auVar89._10_2_;
                auVar90._10_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar64._12_2_;
                sVar84 = auVar89._12_2_;
                sVar87 = auVar89._14_2_;
                auVar90._12_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar64._14_2_;
                auVar90._14_2_ =
                     (ushort)(sVar87 < sVar3) * sVar3 | (ushort)(sVar87 >= sVar3) * sVar87;
                auVar82 = psubsw(auVar82,auVar19);
                auVar85 = psubsw(auVar85,auVar91);
                sVar3 = auVar82._0_2_;
                sVar84 = auVar85._0_2_;
                auVar86._0_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar82._2_2_;
                sVar84 = auVar85._2_2_;
                auVar86._2_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar82._4_2_;
                sVar84 = auVar85._4_2_;
                auVar86._4_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar82._6_2_;
                sVar84 = auVar85._6_2_;
                auVar86._6_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar82._8_2_;
                sVar84 = auVar85._8_2_;
                auVar86._8_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar82._10_2_;
                sVar84 = auVar85._10_2_;
                auVar86._10_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar82._12_2_;
                sVar84 = auVar85._12_2_;
                sVar87 = auVar85._14_2_;
                auVar86._12_2_ =
                     (ushort)(sVar84 < sVar3) * sVar3 | (ushort)(sVar84 >= sVar3) * sVar84;
                sVar3 = auVar82._14_2_;
                auVar86._14_2_ =
                     (ushort)(sVar87 < sVar3) * sVar3 | (ushort)(sVar87 >= sVar3) * sVar87;
                auVar67 = paddsw(auVar67,auVar54);
                uVar69 = ((short)auVar86._0_2_ < (short)auVar90._0_2_) * auVar90._0_2_ |
                         ((short)auVar86._0_2_ >= (short)auVar90._0_2_) * auVar86._0_2_;
                uVar73 = ((short)auVar86._2_2_ < (short)auVar90._2_2_) * auVar90._2_2_ |
                         ((short)auVar86._2_2_ >= (short)auVar90._2_2_) * auVar86._2_2_;
                uVar74 = ((short)auVar86._4_2_ < (short)auVar90._4_2_) * auVar90._4_2_ |
                         ((short)auVar86._4_2_ >= (short)auVar90._4_2_) * auVar86._4_2_;
                uVar75 = ((short)auVar86._6_2_ < (short)auVar90._6_2_) * auVar90._6_2_ |
                         ((short)auVar86._6_2_ >= (short)auVar90._6_2_) * auVar86._6_2_;
                uVar76 = ((short)auVar86._8_2_ < (short)auVar90._8_2_) * auVar90._8_2_ |
                         ((short)auVar86._8_2_ >= (short)auVar90._8_2_) * auVar86._8_2_;
                uVar77 = ((short)auVar86._10_2_ < (short)auVar90._10_2_) * auVar90._10_2_ |
                         ((short)auVar86._10_2_ >= (short)auVar90._10_2_) * auVar86._10_2_;
                uVar78 = ((short)auVar86._12_2_ < (short)auVar90._12_2_) * auVar90._12_2_ |
                         ((short)auVar86._12_2_ >= (short)auVar90._12_2_) * auVar86._12_2_;
                uVar79 = ((short)auVar86._14_2_ < (short)auVar90._14_2_) * auVar90._14_2_ |
                         ((short)auVar86._14_2_ >= (short)auVar90._14_2_) * auVar86._14_2_;
                sVar3 = auVar67._0_2_;
                auVar71._0_2_ =
                     (ushort)((short)uVar69 < sVar3) * sVar3 | ((short)uVar69 >= sVar3) * uVar69;
                sVar3 = auVar67._2_2_;
                auVar71._2_2_ =
                     (ushort)((short)uVar73 < sVar3) * sVar3 | ((short)uVar73 >= sVar3) * uVar73;
                sVar3 = auVar67._4_2_;
                auVar71._4_2_ =
                     (ushort)((short)uVar74 < sVar3) * sVar3 | ((short)uVar74 >= sVar3) * uVar74;
                sVar3 = auVar67._6_2_;
                auVar71._6_2_ =
                     (ushort)((short)uVar75 < sVar3) * sVar3 | ((short)uVar75 >= sVar3) * uVar75;
                sVar3 = auVar67._8_2_;
                auVar71._8_2_ =
                     (ushort)((short)uVar76 < sVar3) * sVar3 | ((short)uVar76 >= sVar3) * uVar76;
                sVar3 = auVar67._10_2_;
                auVar71._10_2_ =
                     (ushort)((short)uVar77 < sVar3) * sVar3 | ((short)uVar77 >= sVar3) * uVar77;
                sVar3 = auVar67._12_2_;
                auVar71._12_2_ =
                     (ushort)((short)uVar78 < sVar3) * sVar3 | ((short)uVar78 >= sVar3) * uVar78;
                sVar3 = auVar67._14_2_;
                auVar71._14_2_ =
                     (ushort)((short)uVar79 < sVar3) * sVar3 | ((short)uVar79 >= sVar3) * uVar79;
                sVar49 = in_XMM8._0_2_;
                auVar89._0_2_ = -(ushort)(sVar49 == -1);
                sVar56 = in_XMM8._2_2_;
                auVar89._2_2_ = -(ushort)(sVar56 == -1);
                sVar57 = in_XMM8._4_2_;
                auVar89._4_2_ = -(ushort)(sVar57 == -1);
                sVar58 = in_XMM8._6_2_;
                auVar89._6_2_ = -(ushort)(sVar58 == -1);
                sVar59 = in_XMM8._8_2_;
                auVar89._8_2_ = -(ushort)(sVar59 == -1);
                sVar60 = in_XMM8._10_2_;
                auVar89._10_2_ = -(ushort)(sVar60 == -1);
                sVar61 = in_XMM8._12_2_;
                sVar62 = in_XMM8._14_2_;
                auVar89._12_2_ = -(ushort)(sVar61 == -1);
                auVar89._14_2_ = -(ushort)(sVar62 == -1);
                auVar82 = pblendvb(auVar71,local_1b8,auVar89);
                auVar64._4_2_ = local_208;
                auVar64._0_4_ = uVar50;
                auVar64._6_2_ = sStack_206;
                auVar64._8_2_ = local_208;
                auVar64._10_2_ = sStack_206;
                auVar64._12_2_ = local_208;
                auVar64._14_2_ = sStack_206;
                auVar91 = pblendvb(auVar90,auVar64,auVar89);
                auVar85 = pblendvb(auVar86,auVar64,auVar89);
                sVar3 = auVar82._0_2_;
                sVar84 = auVar82._2_2_;
                sVar14 = auVar82._14_2_;
                sVar8 = auVar82._8_2_;
                sVar10 = auVar82._10_2_;
                sVar12 = auVar82._12_2_;
                sVar87 = auVar82._4_2_;
                sVar7 = auVar82._6_2_;
                if (7 < uVar32) {
                  bVar4 = sVar3 < (short)local_1a8;
                  uVar77 = (ushort)!bVar4 * (short)local_1a8;
                  bVar5 = sVar84 < local_1a8._2_2_;
                  uVar69 = (ushort)!bVar5 * local_1a8._2_2_;
                  bVar6 = sVar87 < local_1a8._4_2_;
                  uVar76 = (ushort)!bVar6 * local_1a8._4_2_;
                  bVar9 = sVar8 < (short)uStack_1a0;
                  uVar75 = (ushort)!bVar9 * (short)uStack_1a0;
                  bVar11 = sVar10 < uStack_1a0._2_2_;
                  uVar74 = (ushort)!bVar11 * uStack_1a0._2_2_;
                  bVar13 = sVar12 < uStack_1a0._4_2_;
                  uVar73 = (ushort)!bVar13 * uStack_1a0._4_2_;
                  local_1a8 = CONCAT26((ushort)(sVar7 < local_1a8._6_2_) * sVar7 |
                                       (ushort)(sVar7 >= local_1a8._6_2_) * local_1a8._6_2_,
                                       CONCAT24((ushort)bVar6 * sVar87 | uVar76,
                                                CONCAT22((ushort)bVar5 * sVar84 | uVar69,
                                                         (ushort)bVar4 * sVar3 | uVar77)));
                  uStack_1a0 = CONCAT26((ushort)(sVar14 < uStack_1a0._6_2_) * sVar14 |
                                        (ushort)(sVar14 >= uStack_1a0._6_2_) * uStack_1a0._6_2_,
                                        CONCAT24((ushort)bVar13 * sVar12 | uVar73,
                                                 CONCAT22((ushort)bVar11 * sVar10 | uVar74,
                                                          (ushort)bVar9 * sVar8 | uVar75)));
                  local_198._2_2_ =
                       (ushort)((short)local_198._2_2_ < sVar84) * sVar84 |
                       (ushort)((short)local_198._2_2_ >= sVar84) * local_198._2_2_;
                  local_198._0_2_ =
                       (ushort)((short)local_198._0_2_ < sVar3) * sVar3 |
                       (ushort)((short)local_198._0_2_ >= sVar3) * local_198._0_2_;
                  local_198._4_2_ =
                       (ushort)((short)local_198._4_2_ < sVar87) * sVar87 |
                       (ushort)((short)local_198._4_2_ >= sVar87) * local_198._4_2_;
                  local_198._6_2_ =
                       (ushort)((short)local_198._6_2_ < sVar7) * sVar7 |
                       (ushort)((short)local_198._6_2_ >= sVar7) * local_198._6_2_;
                  local_198._8_2_ =
                       (ushort)((short)local_198._8_2_ < sVar8) * sVar8 |
                       (ushort)((short)local_198._8_2_ >= sVar8) * local_198._8_2_;
                  local_198._10_2_ =
                       (ushort)((short)local_198._10_2_ < sVar10) * sVar10 |
                       (ushort)((short)local_198._10_2_ >= sVar10) * local_198._10_2_;
                  local_198._12_2_ =
                       (ushort)((short)local_198._12_2_ < sVar12) * sVar12 |
                       (ushort)((short)local_198._12_2_ >= sVar12) * local_198._12_2_;
                  local_198._14_2_ =
                       (ushort)((short)local_198._14_2_ < sVar14) * sVar14 |
                       (ushort)((short)local_198._14_2_ >= sVar14) * local_198._14_2_;
                }
                piVar2 = ((ppVar24->field_4).rowcols)->score_row;
                if (uVar32 < uVar47) {
                  *(int *)((long)piVar2 + uVar32 * 4 + local_238) = (int)sVar14;
                }
                if (uVar32 - 1 < uVar47 && (long)local_1c0 < lVar48) {
                  *(int *)((long)piVar2 + uVar32 * 4 + local_118) = (int)sVar12;
                }
                if (((long)local_1d0 < lVar48) && ((long)(uVar32 - 2) < (long)uVar47 && 1 < uVar32))
                {
                  *(int *)((long)piVar2 + uVar32 * 4 + local_120) = (int)sVar10;
                }
                if (((long)local_1d8 < lVar48) && ((long)(uVar32 - 3) < (long)uVar47 && 2 < uVar32))
                {
                  *(int *)((long)piVar2 + uVar32 * 4 + local_128) = (int)sVar8;
                }
                if (((long)local_1e0 < lVar48) && ((long)(uVar32 - 4) < (long)uVar47 && 3 < uVar32))
                {
                  *(int *)((long)piVar2 + uVar32 * 4 + local_130) = (int)sVar7;
                }
                if (((long)local_1e8 < lVar48) && ((long)(uVar32 - 5) < (long)uVar47 && 4 < uVar32))
                {
                  *(int *)((long)piVar2 + uVar32 * 4 + local_138) = (int)sVar87;
                }
                if (((long)local_1c8 < lVar48) && ((long)(uVar32 - 6) < (long)uVar47 && 5 < uVar32))
                {
                  *(int *)((long)piVar2 + uVar32 * 4 + local_140) = (int)sVar84;
                }
                if (6 < uVar32 && (long)local_1f0 < lVar48) {
                  *(int *)((long)piVar2 + uVar32 * 4 + local_150 * local_1f0 + -0x1c) = (int)sVar3;
                }
                local_58._0_2_ = auVar53._0_2_;
                local_58._2_2_ = auVar53._2_2_;
                auVar65._0_2_ = -(ushort)((short)local_258._0_2_ < (short)local_58._0_2_);
                auVar65._2_2_ = -(ushort)((short)local_258._2_2_ < (short)local_58._2_2_);
                auVar65._4_2_ = -(ushort)((short)local_258._4_2_ < (short)local_58._0_2_);
                auVar65._6_2_ = -(ushort)((short)local_258._6_2_ < (short)local_58._2_2_);
                auVar65._8_2_ = -(ushort)((short)local_258._8_2_ < (short)local_58._0_2_);
                auVar65._10_2_ = -(ushort)((short)local_258._10_2_ < (short)local_58._2_2_);
                auVar65._12_2_ = -(ushort)((short)local_258._12_2_ < (short)local_58._0_2_);
                auVar65._14_2_ = -(ushort)((short)local_258._14_2_ < (short)local_58._2_2_);
                local_78._0_2_ = auVar63._0_2_;
                local_78._2_2_ = auVar63._2_2_;
                auVar55._0_2_ = -(ushort)(sVar49 < (short)local_78._0_2_);
                auVar55._2_2_ = -(ushort)(sVar56 < (short)local_78._2_2_);
                auVar55._4_2_ = -(ushort)(sVar57 < (short)local_78._0_2_);
                auVar55._6_2_ = -(ushort)(sVar58 < (short)local_78._2_2_);
                auVar55._8_2_ = -(ushort)(sVar59 < (short)local_78._0_2_);
                auVar55._10_2_ = -(ushort)(sVar60 < (short)local_78._2_2_);
                auVar55._12_2_ = -(ushort)(sVar61 < (short)local_78._0_2_);
                auVar55._14_2_ = -(ushort)(sVar62 < (short)local_78._2_2_);
                auVar67 = psraw(in_XMM8,0xf);
                auVar68._0_2_ = -(ushort)(auVar70._0_2_ < sVar3);
                auVar68._2_2_ = -(ushort)(auVar70._2_2_ < sVar84);
                auVar68._4_2_ = -(ushort)(auVar70._4_2_ < sVar87);
                auVar68._6_2_ = -(ushort)(auVar70._6_2_ < sVar7);
                auVar68._8_2_ = -(ushort)(auVar70._8_2_ < sVar8);
                auVar68._10_2_ = -(ushort)(auVar70._10_2_ < sVar10);
                auVar68._12_2_ = -(ushort)(auVar70._12_2_ < sVar12);
                auVar68._14_2_ = -(ushort)(auVar70._14_2_ < sVar14);
                auVar68 = ~auVar67 & auVar55 & auVar81 & auVar68;
                local_168 = pblendvb(auVar70,auVar71,auVar68);
                auVar72._0_2_ = -(ushort)(local_68._0_2_ == sVar49);
                auVar72._2_2_ = -(ushort)(local_68._2_2_ == sVar56);
                auVar72._4_2_ = -(ushort)(local_68._4_2_ == sVar57);
                auVar72._6_2_ = -(ushort)(local_68._6_2_ == sVar58);
                auVar72._8_2_ = -(ushort)(local_68._8_2_ == sVar59);
                auVar72._10_2_ = -(ushort)(local_68._10_2_ == sVar60);
                auVar72._12_2_ = -(ushort)(local_68._12_2_ == sVar61);
                auVar72._14_2_ = -(ushort)(local_68._14_2_ == sVar62);
                auVar70._0_2_ = -(ushort)(auVar66._0_2_ < sVar3);
                auVar70._2_2_ = -(ushort)(auVar66._2_2_ < sVar84);
                auVar70._4_2_ = -(ushort)(auVar66._4_2_ < sVar87);
                auVar70._6_2_ = -(ushort)(auVar66._6_2_ < sVar7);
                auVar70._8_2_ = -(ushort)(auVar66._8_2_ < sVar8);
                auVar70._10_2_ = -(ushort)(auVar66._10_2_ < sVar10);
                auVar70._12_2_ = -(ushort)(auVar66._12_2_ < sVar12);
                auVar70._14_2_ = -(ushort)(auVar66._14_2_ < sVar14);
                auVar70 = auVar65 & auVar72 & auVar70;
                local_178 = pblendvb(auVar66,auVar82,auVar70);
                local_c8 = pblendvb(local_c8,auVar82,auVar72 & auVar81);
                ptr_00[uVar32] = sVar3;
                ptr_01[uVar32] = auVar91._0_2_;
                local_188 = pblendvb(local_188,local_258,auVar70);
                local_48 = pblendvb(local_48,in_XMM8,auVar68);
                in_XMM8 = paddsw(in_XMM8,_DAT_008a1ba0);
                auVar67 = auVar83;
                auVar66 = local_178;
                auVar70 = local_168;
              }
              local_258 = paddsw(local_258,_DAT_008a1bb0);
              auVar18._4_4_ = uStack_d4;
              auVar18._0_4_ = local_d8;
              auVar18._8_4_ = uStack_d0;
              auVar18._12_4_ = uStack_cc;
              local_1b8 = psubsw(local_1b8,auVar18);
              local_238 = local_238 + uVar47 * 0x20;
              uVar32 = local_148;
            }
            lVar48 = 0;
            iVar31 = 0;
            uVar45 = 0;
            uVar36 = uVar33;
            uVar46 = uVar33;
            while( true ) {
              uVar23 = (ushort)uVar36;
              uVar69 = (ushort)uVar33;
              if ((int)lVar48 == 8) break;
              uVar73 = *(ushort *)(local_178 + lVar48 * 2);
              if ((short)uVar23 < (short)uVar73) {
                uVar45 = (int)*(short *)(local_188 + lVar48 * 2);
                uVar36 = (uint)uVar73;
              }
              else if (uVar73 == uVar23) {
                uVar34 = (uint)*(short *)(local_188 + lVar48 * 2);
                uVar30 = uVar45;
                if ((int)uVar34 <= (int)uVar45) {
                  uVar30 = uVar34;
                }
                bVar4 = (int)uVar34 < (int)uVar45;
                uVar45 = uVar30;
                if (bVar4) {
                  uVar36 = (uint)uVar73;
                }
              }
              if ((short)uVar69 < (short)*(ushort *)(local_168 + lVar48 * 2)) {
                iVar31 = (int)*(short *)(local_48 + lVar48 * 2);
                uVar33 = (uint)*(ushort *)(local_168 + lVar48 * 2);
              }
              uVar30 = (uint)*(ushort *)(local_c8 + lVar48 * 2);
              if ((short)*(ushort *)(local_c8 + lVar48 * 2) <= (short)(ushort)uVar46) {
                uVar30 = uVar46;
              }
              uVar46 = uVar30;
              lVar48 = lVar48 + 1;
            }
            if (s1_end == 0 || s2_end == 0) {
              iVar42 = s2Len + -1;
              if ((s1_end == 0) && (uVar23 = (ushort)uVar46, uVar45 = uVar25, s2_end != 0)) {
                iVar42 = iVar31;
                uVar23 = uVar69;
              }
            }
            else if ((short)uVar69 < (short)uVar23) {
              iVar42 = s2Len + -1;
            }
            else if ((uVar23 != uVar69) || (iVar42 = s2Len + -1, iVar31 != s2Len + -1)) {
              iVar42 = iVar31;
              uVar23 = uVar69;
              uVar45 = uVar25;
            }
            auVar53._0_2_ = -(ushort)((short)local_1a8 < local_208);
            auVar53._2_2_ = -(ushort)(local_1a8._2_2_ < sStack_206);
            auVar53._4_2_ = -(ushort)(local_1a8._4_2_ < local_208);
            auVar53._6_2_ = -(ushort)(local_1a8._6_2_ < sStack_206);
            auVar53._8_2_ = -(ushort)((short)uStack_1a0 < local_208);
            auVar53._10_2_ = -(ushort)(uStack_1a0._2_2_ < sStack_206);
            auVar53._12_2_ = -(ushort)(uStack_1a0._4_2_ < local_208);
            auVar53._14_2_ = -(ushort)(uStack_1a0._6_2_ < sStack_206);
            auVar63._0_2_ = -(ushort)(local_e8 < (short)local_198._0_2_);
            auVar63._2_2_ = -(ushort)(sStack_e6 < (short)local_198._2_2_);
            auVar63._4_2_ = -(ushort)(local_e8 < (short)local_198._4_2_);
            auVar63._6_2_ = -(ushort)(sStack_e6 < (short)local_198._6_2_);
            auVar63._8_2_ = -(ushort)(local_e8 < (short)local_198._8_2_);
            auVar63._10_2_ = -(ushort)(sStack_e6 < (short)local_198._10_2_);
            auVar63._12_2_ = -(ushort)(local_e8 < (short)local_198._12_2_);
            auVar63._14_2_ = -(ushort)(sStack_e6 < (short)local_198._14_2_);
            auVar63 = auVar63 | auVar53;
            if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar63 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar63 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              *(byte *)&ppVar24->flag = (byte)ppVar24->flag | 0x40;
              uVar23 = 0;
              iVar42 = 0;
              uVar45 = 0;
            }
            ppVar24->score = (int)(short)uVar23;
            ppVar24->end_query = uVar45;
            ppVar24->end_ref = iVar42;
            sStack_e4 = local_e8;
            sStack_e2 = sStack_e6;
            sStack_e0 = local_e8;
            sStack_de = sStack_e6;
            sStack_dc = local_e8;
            sStack_da = sStack_e6;
            local_b8 = auVar20;
            local_a8 = auVar52;
            local_78 = auVar21;
            local_68 = auVar80;
            local_58 = auVar22;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_270);
              return ppVar24;
            }
            return ppVar24;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar29 = "_s1";
      }
      else {
        uVar32 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_0065ffd0;
        __format = "%s: %s must be > 0\n";
        pcVar29 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_diag_sse41_128_16",pcVar29);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}